

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VWrmsNormMaskVectorArray(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  undefined8 uVar1;
  int ier;
  int i;
  undefined4 local_30;
  undefined4 local_2c;
  
  if (*(long *)(*(long *)(in_RCX + 8) + 0x120) == 0) {
    for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
      uVar1 = (**(code **)(*(long *)(in_RCX + 8) + 0xa8))
                        (*(undefined8 *)(in_RSI + (long)local_2c * 8),
                         *(undefined8 *)(in_RDX + (long)local_2c * 8),in_RCX);
      *(undefined8 *)(in_R8 + (long)local_2c * 8) = uVar1;
    }
    local_30 = 0;
  }
  else {
    local_30 = (**(code **)(*(long *)(in_RCX + 8) + 0x120))(in_EDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_30;
}

Assistant:

int N_VWrmsNormMaskVectorArray(int nvec, N_Vector* X, N_Vector* W, N_Vector id,
                               realtype* nrm)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (id->ops->nvwrmsnormmaskvectorarray != NULL) {

    ier = id->ops->nvwrmsnormmaskvectorarray(nvec, X, W, id, nrm);

  } else {

    for (i=0; i<nvec; i++) {
      nrm[i] = id->ops->nvwrmsnormmask(X[i], W[i], id);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}